

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O3

bool Memory::StandAloneFreeListPolicy::TryEnsureFreeListEntry(StandAloneFreeListPolicy **_this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  StandAloneFreeListPolicy *pSVar6;
  bool bVar7;
  uint uVar8;
  StandAloneFreeListPolicy *obj;
  
  obj = *_this;
  bVar7 = true;
  if (obj->freeList == 0) {
    uVar3 = obj->used;
    if (uVar3 < obj->allocated) {
      obj->used = uVar3 + 1;
      obj->freeList = uVar3 + 1;
    }
    else {
      if (uVar3 != obj->allocated) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                           ,0x3dc,"(_this->used == _this->allocated)",
                           "_this->used == _this->allocated");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        obj = *_this;
        uVar3 = obj->allocated;
      }
      uVar8 = 0x400;
      if (uVar3 < 0x400) {
        uVar8 = uVar3;
      }
      pSVar6 = NewInternal(uVar8 + uVar3);
      if (pSVar6 == (StandAloneFreeListPolicy *)0x0) {
        bVar7 = false;
      }
      else {
        js_memcpy_s(pSVar6->freeObjectLists,0x100,obj->freeObjectLists,0x100);
        js_memcpy_s(pSVar6->entries,(ulong)pSVar6->allocated << 4,obj->entries,(ulong)obj->used << 4
                   );
        uVar4 = obj->used + 1;
        pSVar6->used = uVar4;
        pSVar6->freeList = uVar4;
        *_this = pSVar6;
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::StandAloneFreeListPolicy>
                  (&HeapAllocator::Instance,obj,(ulong)(obj->allocated * 0x10 + 0x100));
      }
    }
  }
  return bVar7;
}

Assistant:

bool StandAloneFreeListPolicy::TryEnsureFreeListEntry(StandAloneFreeListPolicy *& _this)
{
    if (0 == _this->freeList)
    {
        if (_this->used < _this->allocated)
        {
            _this->used++;
            _this->freeList = _this->used;
        }
        else
        {
            Assert(_this->used == _this->allocated);

            StandAloneFreeListPolicy * oldThis = _this;
            uint entries = oldThis->allocated + min(oldThis->allocated, MaxEntriesGrowth);
            StandAloneFreeListPolicy * newThis = NewInternal(entries);
            if (NULL != newThis)
            {
                uint sizeInBytes = buckets * sizeof(uint);
                js_memcpy_s(newThis->freeObjectLists, sizeInBytes, oldThis->freeObjectLists, sizeInBytes);
                js_memcpy_s(newThis->entries, newThis->allocated * sizeof(FreeObjectListEntry), oldThis->entries, oldThis->used * sizeof(FreeObjectListEntry));
                newThis->used = oldThis->used + 1;
                newThis->freeList = newThis->used;
                _this = newThis;
                HeapDeletePlus(GetPlusSize(oldThis), oldThis);
            }
            else
            {
                return false;
            }
        }
    }

    return true;
}